

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

Type * __thiscall
soul::AST::Expression::resolveAsType(Type *__return_storage_ptr__,Expression *this)

{
  CompileMessage local_50;
  Expression *local_18;
  Expression *this_local;
  
  local_18 = this;
  this_local = (Expression *)__return_storage_ptr__;
  Errors::expectedType<>();
  Context::throwError(&(this->super_Statement).super_ASTObject.context,&local_50,false);
}

Assistant:

virtual Type resolveAsType() const                            { context.throwError (Errors::expectedType()); }